

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

bool __thiscall crsGA::Logger::removeLogHandler(Logger *this,string *id)

{
  bool bVar1;
  _Self local_48 [3];
  _Self local_30;
  iterator itr;
  lock_guard<std::mutex> lock;
  string *id_local;
  Logger *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->_mutex);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>_>
       ::find(&this->_logHandlersMap,id);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>_>
       ::end(&this->_logHandlersMap);
  bVar1 = std::operator!=(&local_30,local_48);
  if (bVar1) {
    std::
    map<std::__cxx11::string,std::shared_ptr<crsGA::LogHandler>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<crsGA::LogHandler>>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,std::shared_ptr<crsGA::LogHandler>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<crsGA::LogHandler>>>>
                        *)&this->_logHandlersMap,(iterator)local_30._M_node);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  return bVar1;
}

Assistant:

bool Logger::removeLogHandler(const std::string &id)
{
    std::lock_guard<std::mutex> lock(_mutex);

    auto itr = _logHandlersMap.find(id);
    if (itr != _logHandlersMap.end())
    {
        _logHandlersMap.erase(itr);
        return true;
    }
    return false;
}